

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O2

void __thiscall QPainterPath::addPolygon(QPainterPath *this,QPolygonF *polygon)

{
  qreal *pqVar1;
  int i;
  ulong uVar2;
  long lVar3;
  long in_FS_OFFSET;
  Element local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((polygon->super_QList<QPointF>).d.size != 0) {
    ensureData(this);
    detach(this);
    moveTo(this,(polygon->super_QList<QPointF>).d.ptr);
    lVar3 = 0x10;
    for (uVar2 = 1; uVar2 < (ulong)(polygon->super_QList<QPointF>).d.size; uVar2 = uVar2 + 1) {
      pqVar1 = (qreal *)((long)&((polygon->super_QList<QPointF>).d.ptr)->xp + lVar3);
      local_58.x = *pqVar1;
      local_58.y = pqVar1[1];
      local_58.type = LineToElement;
      local_58._20_4_ = 0xaaaaaaaa;
      QList<QPainterPath::Element>::emplaceBack<QPainterPath::Element_const&>
                (&((this->d_ptr).d.ptr)->elements,&local_58);
      lVar3 = lVar3 + 0x10;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPainterPath::addPolygon(const QPolygonF &polygon)
{
    if (polygon.isEmpty())
        return;

    ensureData();
    detach();

    moveTo(polygon.constFirst());
    for (int i=1; i<polygon.size(); ++i) {
        Element elm = { polygon.at(i).x(), polygon.at(i).y(), LineToElement };
        d_func()->elements << elm;
    }
}